

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O2

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* __thiscall
pobr::imgProcessing::ImgProcessor::process
          (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           *__return_storage_ptr__,ImgProcessor *this)

{
  Mat *pMVar1;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  candidates;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  segments;
  Mat img;
  bool local_f1;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_f0;
  ImgProcessor local_d8;
  Mat local_78 [96];
  
  assertIsReady(this);
  cv::Mat::Mat(local_78,&this->img);
  local_f0.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
  processPreEnhance(&local_d8,&this->img,(bool *)local_78);
  pMVar1 = &local_d8.img;
  cv::Mat::operator=(local_78,pMVar1);
  cv::Mat::~Mat(&local_d8.img);
  local_f0.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
  processBinarize(&local_d8,pMVar1,(bool *)local_78);
  pMVar1 = &local_d8.img;
  cv::Mat::operator=(local_78,pMVar1);
  cv::Mat::~Mat(&local_d8.img);
  local_f0.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
  processBinaryEnhance(&local_d8,pMVar1,(bool *)local_78);
  pMVar1 = &local_d8.img;
  cv::Mat::operator=(local_78,pMVar1);
  cv::Mat::~Mat(&local_d8.img);
  local_f0.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
  processSegmentation((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       *)&local_d8,(ImgProcessor *)pMVar1,local_78,(bool *)&local_f0);
  local_f1 = true;
  processFilterCandidates
            (&local_f0,(ImgProcessor *)pMVar1,
             (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              *)&local_d8,&local_f1);
  local_f1 = true;
  processDetection(__return_storage_ptr__,(ImgProcessor *)pMVar1,&local_f0,&local_f1);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_f0);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector((vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *)&local_d8);
  cv::Mat::~Mat(local_78);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<structs::Segment>
ImgProcessor::process()
const
{
    this->assertIsReady();

    auto img = this->img;

    img = this->processPreEnhance(img, true);
    img = this->processBinarize(img, true);
    img = this->processBinaryEnhance(img, true);

    auto segments = this->processSegmentation(img, true);
    auto candidates = this->processFilterCandidates(segments, true);
    auto letterSegments = this->processDetection(candidates, true);

    return letterSegments;
}